

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

unsigned_short duckdb::Cast::Operation<unsigned_long,_unsigned_short>(unsigned_long input)

{
  bool bVar1;
  string *msg;
  unsigned_short result;
  unsigned_long in_stack_000001a8;
  uint16_t *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffc4;
  unsigned_short local_a;
  
  bVar1 = TryCast::Operation<unsigned_long,_unsigned_short>
                    (CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8,false);
  if (!bVar1) {
    uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
    msg = (string *)__cxa_allocate_exception(0x10);
    CastExceptionText<unsigned_long,_unsigned_short>(in_stack_000001a8);
    InvalidInputException::InvalidInputException
              ((InvalidInputException *)CONCAT44(in_stack_ffffffffffffffc4,uVar2),msg);
    __cxa_throw(msg,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException);
  }
  return local_a;
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}